

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateRationalLiteral(ExpressionTranslateContext *ctx,ExprRationalLiteral *expression)

{
  TypeBase *pTVar1;
  char *format;
  
  pTVar1 = (expression->super_ExprBase).type;
  if (pTVar1 == ctx->ctx->typeFloat) {
    format = "((float)%.9g)";
  }
  else {
    if (pTVar1 != ctx->ctx->typeDouble) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x207,
                    "void TranslateRationalLiteral(ExpressionTranslateContext &, ExprRationalLiteral *)"
                   );
    }
    format = "%.17g";
  }
  Print(ctx,format,expression->value);
  return;
}

Assistant:

void TranslateRationalLiteral(ExpressionTranslateContext &ctx, ExprRationalLiteral *expression)
{
	if(expression->type == ctx.ctx.typeFloat)
		Print(ctx, "((float)%.9g)", expression->value);
	else if(expression->type == ctx.ctx.typeDouble)
		Print(ctx, "%.17g", expression->value);
	else
		assert(!"unknown type");
}